

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QLocale>::emplace<QLocale>
          (QMovableArrayOps<QLocale> *this,qsizetype i,QLocale *args)

{
  QLocale **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_58;
  QLocale tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size == i) {
      qVar5 = QArrayDataPointer<QLocale>::freeSpaceAtEnd((QArrayDataPointer<QLocale> *)this);
      if (qVar5 == 0) goto LAB_002e9116;
      QLocale::QLocale((this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr
                       + (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.
                         size,args);
LAB_002e91fe:
      pqVar2 = &(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_002e91bd;
    }
LAB_002e9116:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QLocale>::freeSpaceAtBegin((QArrayDataPointer<QLocale> *)this);
      if (qVar5 != 0) {
        QLocale::QLocale((this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.
                         ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_002e91fe;
      }
    }
  }
  tmp.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QLocale::QLocale(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size != 0;
  QArrayDataPointer<QLocale>::detachAndGrow
            ((QArrayDataPointer<QLocale> *)this,(uint)(i == 0 && bVar6),1,(QLocale **)0x0,
             (QArrayDataPointer<QLocale> *)0x0);
  if (i == 0 && bVar6) {
    QLocale::QLocale((this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr +
                     -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QLocale>).super_QArrayDataPointer<QLocale>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_58,(QArrayDataPointer<QLocale> *)this,i,1);
    QLocale::QLocale(local_58.displaceFrom,&tmp);
    local_58.displaceFrom = local_58.displaceFrom + 1;
    (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
  }
  QLocale::~QLocale(&tmp);
LAB_002e91bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }